

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

bool arc::iso(atom *a,atom *b)

{
  bool bVar1;
  atom *paVar2;
  atom *paVar3;
  bool local_21;
  atom *b_local;
  atom *a_local;
  
  if (a->type == b->type) {
    if (a->type == T_CONS) {
      paVar2 = car(a);
      paVar3 = car(b);
      bVar1 = iso(paVar2,paVar3);
      local_21 = false;
      if (bVar1) {
        paVar2 = cdr(a);
        paVar3 = cdr(b);
        local_21 = iso(paVar2,paVar3);
      }
      a_local._7_1_ = local_21;
    }
    else {
      a_local._7_1_ = is(a,b);
    }
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool iso(const atom& a, const atom& b) {
		if (a.type == b.type) {
			switch (a.type) {
			case T_CONS:
				return iso(car(a), car(b)) && iso(cdr(a), cdr(b));
			default:
				return is(a, b);
			}
		}
		return 0;
	}